

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_menu_begin_symbol_text
                  (nk_context *ctx,char *title,int len,nk_flags align,nk_symbol_type sym,
                  nk_vec2 size)

{
  nk_vec2 size_00;
  nk_rect header_00;
  nk_rect bounds;
  nk_widget_layout_states nVar1;
  float in_ECX;
  nk_symbol_type in_EDX;
  float unaff_EBX;
  nk_command_buffer *in_RSI;
  long in_RDI;
  float in_R8D;
  undefined8 in_XMM0_Qa;
  nk_button_behavior in_stack_00000010;
  nk_style_button *in_stack_00000018;
  nk_user_font *in_stack_00000020;
  nk_flags state;
  int is_clicked;
  nk_input *in;
  nk_rect header;
  nk_window *win;
  int iStack_64;
  nk_context *in_stack_ffffffffffffffb0;
  nk_window *in_stack_ffffffffffffffb8;
  nk_context *ctx_00;
  undefined4 in_stack_ffffffffffffffc8;
  float fVar2;
  undefined4 in_stack_fffffffffffffff4;
  int iVar3;
  
  fVar2 = (float)in_RDI;
  iVar3 = (int)((ulong)in_RDI >> 0x20);
  if (((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) ||
     (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) == 0)) {
    iVar3 = 0;
  }
  else {
    ctx_00 = *(nk_context **)(in_RDI + 0x40d8);
    nVar1 = nk_widget((nk_rect *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    if (nVar1 == NK_WIDGET_INVALID) {
      iVar3 = 0;
    }
    else {
      if ((nVar1 == NK_WIDGET_ROM) ||
         (iStack_64 = iVar3,
         (*(uint *)((long)(ctx_00->input).keyboard.keys[0x15] + 4) & 0x1000) != 0)) {
        iStack_64 = 0;
      }
      bounds.w = (float)in_stack_fffffffffffffff4;
      bounds.x = (float)(int)in_XMM0_Qa;
      bounds.y = (float)(int)((ulong)in_XMM0_Qa >> 0x20);
      bounds.h = unaff_EBX;
      nk_do_button_text_symbol
                ((nk_flags *)CONCAT44(iVar3,fVar2),in_RSI,bounds,in_EDX,
                 (char *)CONCAT44(in_R8D,in_stack_ffffffffffffffc8),(int)((ulong)ctx_00 >> 0x20),
                 (nk_flags)ctx_00,in_stack_00000010,in_stack_00000018,in_stack_00000020,_state);
      header_00._4_8_ = in_RSI;
      header_00.x = (float)in_EDX;
      header_00.h = fVar2;
      size_00.y = in_ECX;
      size_00.x = in_R8D;
      iVar3 = nk_menu_begin(ctx_00,in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                            iStack_64,header_00,size_00);
    }
  }
  return iVar3;
}

Assistant:

NK_API nk_bool
nk_menu_begin_symbol_text(struct nk_context *ctx, const char *title, int len,
nk_flags align, enum nk_symbol_type sym, struct nk_vec2 size)
{
struct nk_window *win;
struct nk_rect header;
const struct nk_input *in;
int is_clicked = nk_false;
nk_flags state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout)
return 0;

win = ctx->current;
state = nk_widget(&header, ctx);
if (!state) return 0;

in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
if (nk_do_button_text_symbol(&ctx->last_widget_state, &win->buffer,
header, sym, title, len, align, NK_BUTTON_DEFAULT, &ctx->style.menu_button,
ctx->style.font, in)) is_clicked = nk_true;
return nk_menu_begin(ctx, win, title, is_clicked, header, size);
}